

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::bandSolve(Matrix *this,Matrix *A,Matrix *b,int k)

{
  int iVar1;
  double **ppdVar2;
  double *pdVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double **ppdVar8;
  bool bVar9;
  ulong uVar10;
  domain_error *this_00;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  double **ppdVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  Matrix MVar22;
  
  iVar1 = A->rows_;
  uVar10 = (ulong)iVar1;
  if (0 < (long)uVar10) {
    ppdVar2 = A->p;
    uVar19 = 1;
    uVar15 = 0;
    do {
      pdVar3 = ppdVar2[uVar15];
      if ((pdVar3[uVar15] == 0.0) && (!NAN(pdVar3[uVar15]))) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again."
                  );
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      uVar16 = uVar15 + 1;
      if (uVar16 < uVar10 && 2 < k) {
        uVar13 = A->cols_;
        ppdVar4 = b->p;
        pdVar5 = ppdVar4[uVar15];
        uVar14 = uVar19;
        do {
          pdVar6 = ppdVar2[uVar14];
          uVar12 = uVar19;
          if ((long)uVar16 < (long)(int)uVar13) {
            do {
              dVar21 = pdVar6[uVar12];
              if ((dVar21 == 0.0) && (!NAN(dVar21))) break;
              pdVar6[uVar12] = dVar21 - (pdVar6[uVar15] / pdVar3[uVar15]) * pdVar3[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
          }
          pdVar7 = ppdVar4[uVar14];
          *pdVar7 = *pdVar7 - (pdVar6[uVar15] / pdVar3[uVar15]) * *pdVar5;
          pdVar6[uVar15] = 0.0;
        } while (((int)(uVar14 + 1) < iVar1) &&
                (bVar9 = (long)uVar14 < (long)(uVar15 + (long)((k - (k + -1 >> 0x1f)) + -1 >> 1)),
                uVar14 = uVar14 + 1, bVar9));
      }
      uVar19 = uVar19 + 1;
      uVar15 = uVar16;
    } while (uVar16 != uVar10);
  }
  Matrix(this,b->rows_,1);
  ppdVar2 = b->p;
  iVar1 = this->rows_;
  uVar13 = iVar1 - 1;
  ppdVar4 = A->p;
  ppdVar8 = this->p;
  *ppdVar8[(int)uVar13] = *ppdVar2[(int)uVar13] / ppdVar4[(int)uVar13][(int)uVar13];
  if (1 < (long)iVar1) {
    uVar15 = (ulong)uVar13;
    lVar17 = uVar15 * 8;
    ppdVar18 = ppdVar8 + uVar15;
    uVar10 = (ulong)(iVar1 - 2);
    do {
      dVar21 = 0.0;
      if ((long)uVar10 < (long)iVar1 + -1) {
        lVar20 = 0;
        iVar11 = 0;
        do {
          iVar11 = (int)(*(double *)((long)ppdVar4[uVar10] + lVar20 * 8 + lVar17) *
                         *ppdVar18[lVar20] + (double)iVar11);
          lVar20 = lVar20 + 1;
        } while ((int)lVar20 + (int)uVar15 < iVar1);
        dVar21 = (double)iVar11;
      }
      *ppdVar8[uVar10] = (*ppdVar2[uVar10] - dVar21) / ppdVar4[uVar10][uVar10];
      uVar15 = uVar15 - 1;
      ppdVar18 = ppdVar18 + -1;
      lVar17 = lVar17 + -8;
      bVar9 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar9);
  }
  MVar22.p = ppdVar4;
  MVar22._0_8_ = this;
  return MVar22;
}

Assistant:

Matrix Matrix::bandSolve(Matrix A, Matrix b, int k)
{
    // optimized Gaussian elimination
    int bandsBelow = (k - 1) / 2;
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw exception
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_ && j <= i + bandsBelow; ++j) {
            int k = i + 1;
            while (k < A.cols_ && A.p[j][k]) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                k++;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
    }

    return x;
}